

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O2

int mriStep_GetGammas(ARKodeMem ark_mem,sunrealtype *gamma,sunrealtype *gamrat,int **jcur,
                     int *dgamma_fail)

{
  double dVar1;
  undefined4 in_EAX;
  int iVar2;
  undefined4 in_register_00000004;
  ARKodeMRIStepMem step_mem;
  ARKodeMRIStepMem local_28;
  
  local_28 = (ARKodeMRIStepMem)CONCAT44(in_register_00000004,in_EAX);
  iVar2 = mriStep_AccessStepMem(ark_mem,"mriStep_GetGammas",&local_28);
  if (iVar2 == 0) {
    *gamma = local_28->gamma;
    dVar1 = local_28->gamrat;
    *gamrat = dVar1;
    *jcur = &local_28->jcur;
    *dgamma_fail = (uint)(local_28->dgmax <= ABS(dVar1 + -1.0));
  }
  return iVar2;
}

Assistant:

int mriStep_GetGammas(ARKodeMem ark_mem, sunrealtype* gamma, sunrealtype* gamrat,
                      sunbooleantype** jcur, sunbooleantype* dgamma_fail)
{
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* set outputs */
  *gamma       = step_mem->gamma;
  *gamrat      = step_mem->gamrat;
  *jcur        = &step_mem->jcur;
  *dgamma_fail = (SUNRabs(*gamrat - ONE) >= step_mem->dgmax);

  return (ARK_SUCCESS);
}